

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomType.cpp
# Opt level: O0

RealType __thiscall OpenMD::AtomType::getMass(AtomType *this)

{
  mapped_type_conflict1 *pmVar1;
  long in_RDI;
  byte local_46;
  allocator<char> *in_stack_ffffffffffffffc0;
  undefined6 in_stack_ffffffffffffffc8;
  byte bVar2;
  allocator<char> in_stack_ffffffffffffffcf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  AtomType *in_stack_ffffffffffffffe8;
  RealType local_8;
  
  bVar2 = 0;
  local_46 = 0;
  if ((*(byte *)(in_RDI + 0x38) & 1) != 0) {
    std::allocator<char>::allocator();
    bVar2 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffd0,
               (char *)CONCAT17(in_stack_ffffffffffffffcf,CONCAT16(1,in_stack_ffffffffffffffc8)),
               in_stack_ffffffffffffffc0);
    pmVar1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                           *)in_stack_ffffffffffffffd0,
                          (key_type *)
                          CONCAT17(in_stack_ffffffffffffffcf,
                                   CONCAT16(bVar2,in_stack_ffffffffffffffc8)));
    local_46 = *pmVar1 ^ 0xff;
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  }
  if ((bVar2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcf);
  }
  if ((local_46 & 1) == 0) {
    local_8 = *(RealType *)(in_RDI + 0x10);
  }
  else {
    local_8 = getMass(in_stack_ffffffffffffffe8);
  }
  return local_8;
}

Assistant:

RealType AtomType::getMass(void) {
    if (hasBase_ && !myResponsibilities_["mass"])
      return base_->getMass();
    else
      return mass_;
  }